

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O2

void __thiscall
Rml::ElementHandleTargetData::ElementHandleTargetData
          (ElementHandleTargetData *this,Element *target,Context *context,
          Array<NumericValue,_NUM_EDGES> *edge_margin)

{
  ComputedValues *pCVar1;
  Box *pBVar2;
  Vector2f VVar3;
  Array<float,_NUM_EDGES> AVar4;
  
  this->target = target;
  pCVar1 = Element::GetComputedValues(target);
  this->computed = pCVar1;
  pBVar2 = Element::GetBox(target);
  this->box = pBVar2;
  pBVar2 = GetParentBox(target,context);
  this->parent_box = pBVar2;
  VVar3 = Element::GetContainingBlock(target);
  this->containing_block = VVar3;
  this->position = *(byte *)&this->computed->common >> 4 & Fixed;
  AVar4 = ResolveEdgeMargin(target,this->box,edge_margin);
  *&(this->resolved_edge_margin)._M_elems = AVar4._M_elems;
  SetDefiniteMargins(this);
  return;
}

Assistant:

ElementHandleTargetData(Element* target, Context* context, const Array<NumericValue, NUM_EDGES>& edge_margin) :
		target(target), computed(target->GetComputedValues()), box(target->GetBox()), parent_box(GetParentBox(target, context)),
		containing_block(target->GetContainingBlock()), position(computed.position()),
		resolved_edge_margin(ResolveEdgeMargin(target, box, edge_margin))
	{
		SetDefiniteMargins();
	}